

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftrl.cc
# Opt level: O2

void multipredict<true>(ftrl *b,base_learner *param_2,example *ec,size_t count,size_t step,
                       polyprediction *pred,bool finalize_predictions)

{
  uint64_t *puVar1;
  double dVar2;
  vw *all;
  polyprediction *ppVar3;
  size_t sVar4;
  size_t sVar5;
  bool bVar6;
  float fVar7;
  multipredict_info<sparse_parameters> mp;
  multipredict_info<sparse_parameters> local_58;
  
  all = b->all;
  ppVar3 = pred;
  sVar4 = count;
  while (bVar6 = sVar4 != 0, sVar4 = sVar4 - 1, bVar6) {
    ppVar3->scalar = (ec->l).simple.initial;
    ppVar3 = ppVar3 + 1;
  }
  local_58.count = count;
  local_58.step = step;
  local_58.pred = pred;
  if ((b->all->weights).sparse == false) {
    local_58.weights = (sparse_parameters *)&(all->weights).dense_weights;
    local_58.gravity = (float)all->sd->gravity;
    GD::
    foreach_feature<GD::multipredict_info<dense_parameters>,_unsigned_long,_&GD::vec_add_multipredict>
              (all,ec,(multipredict_info<dense_parameters> *)&local_58);
  }
  else {
    local_58.weights = &(all->weights).sparse_weights;
    local_58.gravity = (float)all->sd->gravity;
    GD::
    foreach_feature<GD::multipredict_info<sparse_parameters>,_unsigned_long,_&GD::vec_add_multipredict>
              (all,ec,&local_58);
  }
  dVar2 = all->sd->contraction;
  ppVar3 = pred;
  sVar4 = count;
  if ((dVar2 != 1.0) || (NAN(dVar2))) {
    while (sVar4 != 0) {
      ppVar3->scalar = (float)all->sd->contraction * ppVar3->scalar;
      ppVar3 = ppVar3 + 1;
      sVar4 = sVar4 - 1;
    }
  }
  ppVar3 = pred;
  sVar4 = count;
  sVar5 = count;
  if (finalize_predictions) {
    while (sVar5 != 0) {
      fVar7 = GD::finalize_prediction(all->sd,ppVar3->scalar);
      ppVar3->scalar = fVar7;
      ppVar3 = ppVar3 + 1;
      sVar5 = sVar5 - 1;
    }
  }
  while (sVar4 != 0) {
    (ec->pred).scalar = pred->scalar;
    GD::print_audit_features(all,ec);
    puVar1 = &(ec->super_example_predict).ft_offset;
    *puVar1 = *puVar1 + step;
    pred = pred + 1;
    sVar4 = sVar4 - 1;
  }
  puVar1 = &(ec->super_example_predict).ft_offset;
  *puVar1 = *puVar1 - step * count;
  return;
}

Assistant:

void multipredict(
    ftrl& b, base_learner&, example& ec, size_t count, size_t step, polyprediction* pred, bool finalize_predictions)
{
  vw& all = *b.all;
  for (size_t c = 0; c < count; c++) pred[c].scalar = ec.l.simple.initial;
  if (b.all->weights.sparse)
  {
    GD::multipredict_info<sparse_parameters> mp = {
        count, step, pred, all.weights.sparse_weights, (float)all.sd->gravity};
    GD::foreach_feature<GD::multipredict_info<sparse_parameters>, uint64_t, GD::vec_add_multipredict>(all, ec, mp);
  }
  else
  {
    GD::multipredict_info<dense_parameters> mp = {count, step, pred, all.weights.dense_weights, (float)all.sd->gravity};
    GD::foreach_feature<GD::multipredict_info<dense_parameters>, uint64_t, GD::vec_add_multipredict>(all, ec, mp);
  }
  if (all.sd->contraction != 1.)
    for (size_t c = 0; c < count; c++) pred[c].scalar *= (float)all.sd->contraction;
  if (finalize_predictions)
    for (size_t c = 0; c < count; c++) pred[c].scalar = GD::finalize_prediction(all.sd, pred[c].scalar);
  if (audit)
  {
    for (size_t c = 0; c < count; c++)
    {
      ec.pred.scalar = pred[c].scalar;
      GD::print_audit_features(all, ec);
      ec.ft_offset += (uint64_t)step;
    }
    ec.ft_offset -= (uint64_t)(step * count);
  }
}